

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SquareMatrix.hpp
# Opt level: O3

SquareMatrix<std::complex<double>_> * __thiscall
qclab::dense::SquareMatrix<std::complex<double>_>::operator=
          (SquareMatrix<std::complex<double>_> *this,SquareMatrix<std::complex<double>_> *matrix)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  complex<double> *pcVar3;
  undefined8 uVar4;
  complex<double> *__s;
  long lVar5;
  ulong uVar6;
  
  lVar5 = matrix->size_;
  if (lVar5 != this->size_) {
    this->size_ = lVar5;
    if (lVar5 == 0) {
      __assert_fail("size > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/dense/memory.hpp"
                    ,0x12,
                    "auto qclab::dense::alloc_unique_array(const int64_t) [T = std::complex<double>]"
                   );
    }
    uVar6 = lVar5 * lVar5 * 0x10;
    __s = (complex<double> *)operator_new__(-(ulong)((ulong)(lVar5 * lVar5) >> 0x3c != 0) | uVar6);
    memset(__s,0,uVar6);
    pcVar3 = (this->data_)._M_t.
             super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
             .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
    (this->data_)._M_t.
    super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t.
    super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
    super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl = __s;
    if (pcVar3 == (complex<double> *)0x0) goto LAB_0010bd23;
    operator_delete__(pcVar3);
    lVar5 = this->size_;
  }
  if (lVar5 == 0) {
    return this;
  }
LAB_0010bd23:
  pcVar3 = (matrix->data_)._M_t.
           super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
           .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
  lVar5 = 0;
  uVar6 = 0;
  do {
    puVar1 = (undefined8 *)(pcVar3->_M_value + lVar5);
    uVar4 = puVar1[1];
    puVar2 = (undefined8 *)
             (((this->data_)._M_t.
               super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
               .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl)->_M_value + lVar5
             );
    *puVar2 = *puVar1;
    puVar2[1] = uVar4;
    uVar6 = uVar6 + 1;
    lVar5 = lVar5 + 0x10;
  } while (uVar6 < (ulong)(this->size_ * this->size_));
  return this;
}

Assistant:

SquareMatrix< T >& operator=( const SquareMatrix< T >& matrix ) {
          if ( matrix.size() != size_ ) {
            size_ = matrix.size() ;
            data_ = std::move( alloc_unique_array< T >( size_ * size_ ) ) ;
          }
          const T* data = matrix.ptr() ;
          #pragma omp parallel for
          for ( int64_t i = 0; i < size_*size_; i++ ) {
            data_[i] = data[i] ;
          }
          return *this ;
        }